

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGrid.cpp
# Opt level: O2

void __thiscall TasGrid::TasmanianSparseGrid::getPoints(TasmanianSparseGrid *this,double *x)

{
  BaseCanonicalGrid *pBVar1;
  MultiIndexSet *pMVar2;
  
  (*((this->base)._M_t.
     super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
     ._M_t.
     super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
     .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl)->
    _vptr_BaseCanonicalGrid[0xb])();
  pBVar1 = (this->base)._M_t.
           super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           ._M_t.
           super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl;
  pMVar2 = &pBVar1->points;
  if (*(pointer *)&(pBVar1->points).indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl ==
      (pBVar1->points).indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pMVar2 = &pBVar1->needed;
  }
  formTransformedPoints(this,*(int *)((long)pMVar2 + 8),x);
  return;
}

Assistant:

void TasmanianSparseGrid::getPoints(double *x) const{
    base->getPoints(x);
    formTransformedPoints(base->getNumPoints(), x);
}